

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * Corrade::Utility::String::uppercase(String *__return_storage_ptr__,String *string)

{
  bool bVar1;
  Deleter p_Var2;
  size_t extraout_RDX;
  MutableStringView string_00;
  BasicStringView<char> local_40;
  String local_30;
  String *local_18;
  String *string_local;
  
  local_18 = string;
  string_local = __return_storage_ptr__;
  bVar1 = Containers::String::isSmall(string);
  if (!bVar1) {
    p_Var2 = Containers::String::deleter(string);
    if (p_Var2 != (Deleter)0x0) {
      Containers::String::String(&local_30,string);
      Containers::String::operator=(string,&local_30);
      Containers::String::~String(&local_30);
    }
  }
  Containers::BasicStringView<char>::BasicStringView(&local_40,string);
  string_00._sizePlusFlags = extraout_RDX;
  string_00._data = (char *)local_40._sizePlusFlags;
  uppercaseInPlace((String *)local_40._data,string_00);
  Containers::String::String(__return_storage_ptr__,string);
  return __return_storage_ptr__;
}

Assistant:

Containers::String uppercase(Containers::String string) {
    /* In the rare scenario where we'd get a non-owned string (such as
       String::nullTerminatedView() passed right into the function), make it
       owned first. Usually it'll get copied however, which already makes it
       owned. */
    if(!string.isSmall() && string.deleter()) string = Containers::String{string};

    uppercaseInPlace(string);
    return string;
}